

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

bool QChar::isPrint(char32_t ucs4)

{
  Properties *pPVar1;
  
  if (0x10ffff < (uint)ucs4) {
    return false;
  }
  pPVar1 = QUnicodeTables::qGetProp(ucs4);
  return (0x3e00U >> (*(byte *)pPVar1 & 0x1f) & 1) == 0;
}

Assistant:

bool QChar::isPrint(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return false;
    const int test = FLAG(Other_Control) |
                     FLAG(Other_Format) |
                     FLAG(Other_Surrogate) |
                     FLAG(Other_PrivateUse) |
                     FLAG(Other_NotAssigned);
    return !(FLAG(qGetProp(ucs4)->category) & test);
}